

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

int Abc_NtkFinSimOneBit(Abc_Obj_t *pObj,int Type,Vec_Wrd_t *vSims,int nWords,int iBit)

{
  Mio_Library_t *pLib_00;
  int iVar1;
  int iVar2;
  word *p;
  Mio_Gate_t *pGate;
  uint local_c4;
  uint local_c0;
  word *local_b0;
  word *local_98;
  int iBit1;
  int iBit0;
  word *pSim1;
  word *pSim0_1;
  word *pSim0;
  int iBits [6];
  int i;
  Mio_Library_t *pLib;
  int iBit_local;
  int nWords_local;
  Vec_Wrd_t *vSims_local;
  int Type_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NtkIsMappedLogic(pObj->pNtk);
  if ((iVar1 == 0) || (Type < 0)) {
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 < 1) {
      local_98 = (word *)0x0;
    }
    else {
      iVar1 = Abc_ObjFaninId0(pObj);
      local_98 = Vec_WrdEntryP(vSims,nWords * iVar1);
    }
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 < 2) {
      local_b0 = (word *)0x0;
    }
    else {
      iVar1 = Abc_ObjFaninId1(pObj);
      local_b0 = Vec_WrdEntryP(vSims,nWords * iVar1);
    }
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 < 1) {
      local_c0 = 0xffffffff;
    }
    else {
      local_c0 = Abc_InfoHasBit((uint *)local_98,iBit);
    }
    iVar1 = Abc_ObjFaninNum(pObj);
    if (iVar1 < 2) {
      local_c4 = 0xffffffff;
    }
    else {
      local_c4 = Abc_InfoHasBit((uint *)local_b0,iBit);
    }
    if (Type == -0x61) {
      __assert_fail("Type != ABC_FIN_NEG",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                    ,0x29a,"int Abc_NtkFinSimOneBit(Abc_Obj_t *, int, Vec_Wrd_t *, int, int)");
    }
    if (Type == -99) {
      pObj_local._4_4_ = 0;
    }
    else if (Type == -0x62) {
      pObj_local._4_4_ = 1;
    }
    else if (Type == -0x59) {
      pObj_local._4_4_ = local_c0;
    }
    else if (Type == -0x5a) {
      pObj_local._4_4_ = (uint)((local_c0 != 0 ^ 0xffU) & 1);
    }
    else if (Type == -0x60) {
      pObj_local._4_4_ = local_c0 & local_c4;
    }
    else if (Type == -0x5e) {
      pObj_local._4_4_ = local_c0 | local_c4;
    }
    else if (Type == -0x5c) {
      pObj_local._4_4_ = local_c0 ^ local_c4;
    }
    else if (Type == -0x5f) {
      pObj_local._4_4_ = (uint)(((local_c0 & local_c4) != 0 ^ 0xffU) & 1);
    }
    else if (Type == -0x5d) {
      pObj_local._4_4_ = (uint)(((local_c0 != 0 || local_c4 != 0) ^ 0xffU) & 1);
    }
    else {
      if (Type != -0x5b) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                      ,0x2a5,"int Abc_NtkFinSimOneBit(Abc_Obj_t *, int, Vec_Wrd_t *, int, int)");
      }
      pObj_local._4_4_ = (uint)((local_c0 != local_c4 ^ 0xffU) & 1);
    }
  }
  else {
    pLib_00 = (Mio_Library_t *)pObj->pNtk->pManFunc;
    iBits[5] = 0;
    while( true ) {
      iVar1 = iBits[5];
      iVar2 = Abc_ObjFaninNum(pObj);
      if (iVar2 <= iVar1) break;
      iVar1 = Abc_ObjFaninId(pObj,iBits[5]);
      p = Vec_WrdEntryP(vSims,nWords * iVar1);
      iVar1 = Abc_InfoHasBit((uint *)p,iBit);
      iBits[(long)iBits[5] + -2] = iVar1;
      iBits[5] = iBits[5] + 1;
    }
    pGate = Mio_LibraryReadGateById(pLib_00,Type);
    pObj_local._4_4_ = Mio_LibGateSimulateOne(pGate,(int *)&pSim0);
  }
  return pObj_local._4_4_;
}

Assistant:

static inline int Abc_NtkFinSimOneBit( Abc_Obj_t * pObj, int Type, Vec_Wrd_t * vSims, int nWords, int iBit )
{
    if ( Abc_NtkIsMappedLogic(pObj->pNtk) && Type >= 0 )
    {
        extern int Mio_LibGateSimulateOne( Mio_Gate_t * pGate, int iBits[6] );
        Mio_Library_t * pLib = (Mio_Library_t *)pObj->pNtk->pManFunc;
        int i, iBits[6];
        for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
        {
            word * pSim0 = Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId(pObj, i) );
            iBits[i] = Abc_InfoHasBit( (unsigned*)pSim0, iBit );
        }
        return Mio_LibGateSimulateOne( Mio_LibraryReadGateById(pLib, Type), iBits );
    }
    else
    {
        word * pSim0 = Abc_ObjFaninNum(pObj) > 0 ? Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId0(pObj) ) : NULL;
        word * pSim1 = Abc_ObjFaninNum(pObj) > 1 ? Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId1(pObj) ) : NULL;
        int iBit0 = Abc_ObjFaninNum(pObj) > 0 ? Abc_InfoHasBit( (unsigned*)pSim0, iBit ) : -1;
        int iBit1 = Abc_ObjFaninNum(pObj) > 1 ? Abc_InfoHasBit( (unsigned*)pSim1, iBit ) : -1;
        assert( Type != ABC_FIN_NEG );
        if ( Type == ABC_FIN_SA0 )            return 0;
        if ( Type == ABC_FIN_SA1 )            return 1;
        if ( Type == ABC_FIN_RDOB_BUFF )      return iBit0;
        if ( Type == ABC_FIN_RDOB_NOT )       return !iBit0;
        if ( Type == ABC_FIN_RDOB_AND )       return iBit0 & iBit1;
        if ( Type == ABC_FIN_RDOB_OR )        return iBit0 | iBit1;
        if ( Type == ABC_FIN_RDOB_XOR )       return iBit0 ^ iBit1;
        if ( Type == ABC_FIN_RDOB_NAND )      return !(iBit0 & iBit1);
        if ( Type == ABC_FIN_RDOB_NOR )       return !(iBit0 | iBit1);
        if ( Type == ABC_FIN_RDOB_NXOR )      return !(iBit0 ^ iBit1);
        assert( 0 );
        return -1;
    }
}